

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Lookup.cpp
# Opt level: O2

v3i idx2::GetSpatialBrick(idx2_file *Idx2,int Level,u64 LinearBrick)

{
  byte *pbVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  v3i vVar5;
  v3i Brick3;
  uint auStack_36c [211];
  code *pcStack_20;
  undefined8 local_c;
  int local_4;
  
  pbVar1 = (Idx2->BricksOrderStr).Buffer.Data;
  uVar2 = (ulong)pbVar1[(long)Level * 0x81 + 0x80];
  local_c = 0;
  local_4 = 0;
  lVar3 = 0;
  while( true ) {
    uVar2 = uVar2 - 1;
    if (uVar2 == 0xffffffffffffffff) {
      vVar5.field_0._8_4_ = local_4 >> 1;
      vVar5.field_0.field_0.Y = local_c._4_4_ >> 1;
      vVar5.field_0.field_0.X = (int)local_c >> 1;
      return (v3i)vVar5.field_0;
    }
    if (lVar3 == 0x80) break;
    lVar4 = (long)(char)pbVar1[lVar3 + (long)Level * 0x81];
    if (0x5a < lVar4) {
      pcStack_20 = ChunkAddressToSpatial;
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    auStack_36c[lVar4 + 0x80] =
         ((uint)((LinearBrick >> (uVar2 & 0x3f) & 1) != 0) | auStack_36c[lVar4 + 0x80]) * 2;
    lVar3 = lVar3 + 1;
  }
  pcStack_20 = (code *)0x163ebd;
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x237,"char &idx2::stack_string<128>::operator[](int) const [N = 128]");
}

Assistant:

v3i
GetSpatialBrick(const idx2_file& Idx2, int Level, u64 LinearBrick)
{
  int Size = Idx2.BricksOrderStr[Level].Len;
  v3i Brick3(0);
  for (int I = 0; I < Size; ++I)
  {
    int D = Idx2.BricksOrderStr[Level][I] - 'X';
    int J = Size - I - 1;
    Brick3[D] |= (LinearBrick & (u64(1) << J)) >> J;
    Brick3[D] <<= 1;
  }
  return Brick3 >> 1;
}